

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtz.cpp
# Opt level: O0

void gen_ofs_string(char *buf,size_t buflen,char *prefix,int32_t ofs,int flags)

{
  int in_ECX;
  int iVar1;
  undefined8 in_RDX;
  size_t in_RSI;
  char *in_RDI;
  uint in_R8D;
  char *fmt;
  int ss;
  int mm;
  int hh;
  char *signch;
  char *local_50;
  char *local_48;
  char *local_28;
  int local_1c;
  
  local_28 = "";
  if (in_ECX < 0) {
    local_1c = -in_ECX;
    local_28 = "-";
  }
  else {
    local_1c = in_ECX;
    if ((in_R8D & 2) != 0) {
      local_28 = "+";
    }
  }
  iVar1 = (int)((long)((ulong)(uint)((int)((long)local_1c / 0x3c) >> 0x1f) << 0x20 |
                      (long)local_1c / 0x3c & 0xffffffffU) % 0x3c);
  if (local_1c % 0x3c == 0) {
    if (iVar1 == 0) {
      local_50 = "%s";
      if (local_1c / 0xe10 != 0 || (in_R8D & 1) == 0) {
        local_50 = "%s%s%d";
      }
    }
    else {
      local_50 = "%s%s%d:%02d";
    }
    local_48 = local_50;
  }
  else {
    local_48 = "%s%s%d:%02d:%02d";
  }
  t3sprintf(in_RDI,in_RSI,local_48,in_RDX,local_28,(ulong)(uint)(local_1c / 0xe10),iVar1,
            local_1c % 0x3c);
  return;
}

Assistant:

static void gen_ofs_string(char *buf, size_t buflen,
                           const char *prefix, int32_t ofs, int flags)
{
    /* figure the sign */
    const char *signch = "";
    if (ofs < 0)
        ofs = -ofs, signch = "-";
    else if ((flags & F_PLUS_SIGN) != 0)
        signch = "+";

    /* decompose the offset into hours, minutes, and seconds */
    int hh = ofs / (60*60);
    int mm = ofs/60 % 60;
    int ss = ofs % 60;

    /* 
     *   figure the format: prefix, sign character, then h:mm:ss if we have
     *   non-zero seconds, h:mm if we have non-zero minutes but no seconds,
     *   or just the hours if the minutes and seconds are both zero 
     */ 
    const char *fmt = (ss != 0 ? "%s%s%d:%02d:%02d" :
                       mm != 0 ? "%s%s%d:%02d" :
                       hh != 0 || (flags & F_HIDE_ZERO) == 0 ? "%s%s%d" :
                       "%s");

    /* generate the string */
    t3sprintf(buf, buflen, fmt, prefix, signch, hh, mm, ss);
}